

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceMesh::buildCornerInfoGui(SurfaceMesh *this,size_t cInd)

{
  bool bVar1;
  iterator id;
  iterator iVar2;
  pointer pSVar3;
  undefined8 in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>
  *x;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
  *__range1;
  size_t displayInd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_ffffffffffffff78;
  _Self in_stack_ffffffffffffff80;
  _Self in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int iVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
  *pmVar4;
  unsigned_long in_stack_ffffffffffffffa8;
  string local_38 [40];
  undefined8 local_10;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffa8;
  local_10 = in_RSI;
  std::__cxx11::to_string(in_stack_ffffffffffffffa8);
  std::operator+(in_stack_ffffffffffffff78,__rhs);
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted((char *)__rhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent((float)((ulong)in_stack_ffffffffffffff80._M_node >> 0x20));
  ImGui::Columns(iVar5,(char *)in_stack_ffffffffffffff88._M_node,
                 SUB81((ulong)in_stack_ffffffffffffff80._M_node >> 0x38,0));
  ImGui::GetWindowWidth();
  ImGui::SetColumnWidth
            ((int)((ulong)in_stack_ffffffffffffff80._M_node >> 0x20),
             SUB84(in_stack_ffffffffffffff80._M_node,0));
  pmVar4 = in_RDI + 0x14;
  id = std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
       ::begin(in_RDI);
  iVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>_>
          ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff88,(_Self *)&stack0xffffffffffffff80);
    iVar5 = (int)((ulong)pmVar4 >> 0x20);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>
                 *)0x474211);
    pSVar3 = std::
             unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>
             ::operator->((unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>
                           *)0x474224);
    (*(pSVar3->super_QuantityS<polyscope::SurfaceMesh>).super_Quantity._vptr_Quantity[0xe])
              (pSVar3,local_10);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::SurfaceMeshQuantity,_std::default_delete<polyscope::SurfaceMeshQuantity>_>_>_>
                  *)__rhs);
  }
  ImGui::Indent((float)((ulong)iVar2._M_node >> 0x20));
  ImGui::Columns(iVar5,(char *)id._M_node,SUB81((ulong)iVar2._M_node >> 0x38,0));
  return;
}

Assistant:

void SurfaceMesh::buildCornerInfoGui(size_t cInd) {
  size_t displayInd = cInd;
  ImGui::TextUnformatted(("Corner #" + std::to_string(displayInd)).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildCornerInfoGUI(cInd);
  }

  ImGui::Indent(-20.);
  ImGui::Columns(1);
}